

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

void HSendPacket(int node,int len)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  int *piVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  PacketStore store;
  undefined4 extraout_var;
  
  __stream = debugfile;
  uVar6 = (ulong)(uint)len;
  if (node != 0 && debugfile != (FILE *)0x0) {
    uVar10 = (uint)doomcom.data[0];
    if ((doomcom.data[0] & 0x20) == 0) {
      if ((char)doomcom.data[0] < '\0') {
        fprintf((FILE *)debugfile,"%i/%i send %i = EXIT [%3i]",(ulong)(uint)gametic,
                (ulong)(uint)maketic,node,uVar6);
        uVar4 = 0;
        if (0 < len) {
          uVar4 = uVar6;
        }
        for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
          fprintf((FILE *)debugfile," %2x",(ulong)doomcom.data[uVar6]);
        }
      }
      else {
        uVar8 = (consoleplayer == Net_Arbitrator && NetMode == '\x01') | 2;
        if (doomcom.data[0] < 0x40) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar4 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
          iVar2 = ExpandTics((uint)doomcom.data[uVar4]);
          uVar5 = CONCAT44(extraout_var,iVar2);
        }
        iVar3 = gametic;
        iVar2 = maketic;
        uVar10 = uVar10 & 3;
        if (uVar10 == 3) {
          uVar4 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
          uVar10 = doomcom.data[uVar4] + 3;
        }
        uVar1 = ExpandTics((uint)doomcom.data[1]);
        fprintf((FILE *)__stream,"%i/%i send %i = (%i + %i, R %i) [%3i]",(ulong)(uint)iVar3,
                (ulong)(uint)iVar2,node,(ulong)uVar1,(ulong)uVar10,uVar5,uVar6);
        uVar4 = 0;
        if (0 < len) {
          uVar4 = uVar6;
        }
        for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
          uVar5 = 0x20;
          if (uVar8 == uVar6) {
            uVar5 = 0x7c;
          }
          fprintf((FILE *)debugfile,"%c%2x",uVar5,(ulong)doomcom.data[uVar6]);
        }
      }
    }
    else {
      fprintf((FILE *)debugfile,"%i/%i send %i = SETUP [%3i]",(ulong)(uint)gametic,
              (ulong)(uint)maketic,node,uVar6);
      uVar4 = 0;
      if (0 < len) {
        uVar4 = uVar6;
      }
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        fprintf((FILE *)debugfile," %2x",(ulong)doomcom.data[uVar6]);
      }
    }
    fwrite(" [[ ",4,1,(FILE *)debugfile);
    piVar7 = nettics;
    for (lVar9 = 0; lVar9 < doomcom.numnodes; lVar9 = lVar9 + 1) {
      if (nodeingame[lVar9] == true) {
        fprintf((FILE *)debugfile,"%d ",(ulong)(uint)*piVar7);
      }
      else {
        fwrite("--- ",4,1,(FILE *)debugfile);
      }
      piVar7 = (int *)((uint *)piVar7 + 1);
    }
    fwrite("]]\n",3,1,(FILE *)debugfile);
  }
  if (node == 0) {
    memcpy(reboundstore,doomcom.data,(long)len);
    reboundpacket = len;
  }
  else if (demoplayback == false) {
    if (netgame == false) {
      I_Error("Tried to transmit to another node");
    }
    doomcom.command = 1;
    doomcom.remotenode = (SWORD)node;
    doomcom.datalength = (SWORD)len;
    if (net_fakelatency.Value < 2) {
      I_NetCmd();
    }
    else {
      memcpy(&store.message,&doomcom,0x36c4);
      iVar2 = (*I_GetTime)(false);
      store.timer = net_fakelatency.Value / 0x38 + iVar2;
      TArray<PacketStore,_PacketStore>::Push(&OutBuffer,&store);
    }
    uVar6 = 0;
    while (uVar10 = (uint)uVar6, uVar10 < OutBuffer.Count) {
      iVar2 = OutBuffer.Array[uVar6].timer;
      iVar3 = (*I_GetTime)(false);
      if (iVar2 <= iVar3) {
        memcpy(&doomcom,&OutBuffer.Array[uVar6].message,0x36c4);
        I_NetCmd();
        TArray<PacketStore,_PacketStore>::Delete(&OutBuffer,uVar10);
        uVar10 = 0xffffffff;
      }
      uVar6 = (ulong)(uVar10 + 1);
    }
  }
  return;
}

Assistant:

void HSendPacket (int node, int len)
{
	if (debugfile && node != 0)
	{
		int i, k, realretrans;

		if (netbuffer[0] & NCMD_SETUP)
		{
			fprintf (debugfile,"%i/%i send %i = SETUP [%3i]", gametic, maketic, node, len);
			for (i = 0; i < len; i++)
				fprintf (debugfile," %2x", ((BYTE *)netbuffer)[i]);
		}
		else if (netbuffer[0] & NCMD_EXIT)
		{
			fprintf (debugfile,"%i/%i send %i = EXIT [%3i]", gametic, maketic, node, len);
			for (i = 0; i < len; i++)
				fprintf (debugfile," %2x", ((BYTE *)netbuffer)[i]);
		}
		else
		{
			k = 2;

			if (NetMode == NET_PacketServer && consoleplayer == Net_Arbitrator &&
				node != 0)
			{
				k++;
			}

			if (netbuffer[0] & NCMD_RETRANSMIT)
				realretrans = ExpandTics (netbuffer[k++]);
			else
				realretrans = -1;

			int numtics = netbuffer[0] & 3;
			if (numtics == 3)
				numtics += netbuffer[k++];

			fprintf (debugfile,"%i/%i send %i = (%i + %i, R %i) [%3i]",
					gametic, maketic,
					node,
					ExpandTics(netbuffer[1]),
					numtics, realretrans, len);
			
			for (i = 0; i < len; i++)
				fprintf (debugfile, "%c%2x", i==k?'|':' ', ((BYTE *)netbuffer)[i]);
		}
		fprintf (debugfile, " [[ ");
		for (i = 0; i < doomcom.numnodes; ++i)
		{
			if (nodeingame[i])
			{
				fprintf (debugfile, "%d ", nettics[i]);
			}
			else
			{
				fprintf (debugfile, "--- ");
			}
		}
		fprintf (debugfile, "]]\n");
	}

	if (node == 0)
	{
		memcpy (reboundstore, netbuffer, len);
		reboundpacket = len;
		return;
	}

	if (demoplayback)
		return;

	if (!netgame)
		I_Error ("Tried to transmit to another node");

#if SIMULATEERRORS
	if (rand() < SIMULATEERRORS)
	{
		if (debugfile)
			fprintf (debugfile, "Drop!\n");
		return;
	}
#endif

	doomcom.command = CMD_SEND;
	doomcom.remotenode = node;
	doomcom.datalength = len;

#ifdef _DEBUG
	if (net_fakelatency / 2 > 0)
	{
		PacketStore store;
		store.message = doomcom;
		store.timer = I_GetTime(false) + ((net_fakelatency / 2) / (1000 / TICRATE));
		OutBuffer.Push(store);
	}
	else
		I_NetCmd();

	for (unsigned int i = 0; i < OutBuffer.Size(); i++)
	{
		if (OutBuffer[i].timer <= I_GetTime(false))
		{
			doomcom = OutBuffer[i].message;
			I_NetCmd();
			OutBuffer.Delete(i);
			i = -1;
		}
	}
#else
	I_NetCmd();
#endif
}